

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O2

bool __thiscall MeCab::Writer::writeEM(Writer *this,Lattice *lattice,StringBuffer *os)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  StringBuffer *pSVar4;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *extraout_RDX_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *extraout_RDX_03;
  void *pvVar5;
  long *plVar6;
  long lVar3;
  
  iVar2 = (*lattice->_vptr_Lattice[2])(lattice);
  lVar3 = CONCAT44(extraout_var,iVar2);
  pvVar5 = extraout_RDX;
  do {
    if (lVar3 == 0) {
      StringBuffer::write(os,0x127dea,pvVar5,in_RCX);
      return true;
    }
    if (0.0001 <= *(float *)(lVar3 + 0x5c)) {
      StringBuffer::write(os,0x12a284,pvVar5,in_RCX);
      if (*(char *)(lVar3 + 0x4f) == '\x03') {
        iVar2 = 0x129400;
LAB_00124bb8:
        StringBuffer::write(os,iVar2,__buf,in_RCX);
        pvVar5 = extraout_RDX_00;
      }
      else {
        if (*(char *)(lVar3 + 0x4f) == '\x02') {
          iVar2 = 0x12a287;
          goto LAB_00124bb8;
        }
        StringBuffer::write(os,(int)*(undefined8 *)(lVar3 + 0x30),
                            (void *)(ulong)*(ushort *)(lVar3 + 0x44),in_RCX);
        pvVar5 = extraout_RDX_01;
      }
      pSVar4 = (StringBuffer *)StringBuffer::write(os,9,pvVar5,in_RCX);
      pSVar4 = (StringBuffer *)
               StringBuffer::write(pSVar4,(int)*(undefined8 *)(lVar3 + 0x38),__buf_00,in_RCX);
      pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,9,__buf_01,in_RCX);
      pSVar4 = StringBuffer::operator<<(pSVar4,(double)*(float *)(lVar3 + 0x5c));
      StringBuffer::write(pSVar4,10,__buf_02,in_RCX);
      pvVar5 = extraout_RDX_02;
    }
    plVar6 = (long *)(lVar3 + 0x28);
    while (lVar1 = *plVar6, lVar1 != 0) {
      if (0.0001 <= *(float *)(lVar1 + 0x24)) {
        pSVar4 = (StringBuffer *)StringBuffer::write(os,0x12a28b,pvVar5,in_RCX);
        in_RCX = *(size_t *)(lVar1 + 0x10);
        pSVar4 = (StringBuffer *)
                 StringBuffer::write(pSVar4,(int)*(undefined8 *)(in_RCX + 0x38),__buf_03,in_RCX);
        pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,9,__buf_04,in_RCX);
        pSVar4 = (StringBuffer *)
                 StringBuffer::write(pSVar4,(int)*(undefined8 *)(lVar3 + 0x38),__buf_05,in_RCX);
        pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,9,__buf_06,in_RCX);
        pSVar4 = StringBuffer::operator<<(pSVar4,(double)*(float *)(lVar1 + 0x24));
        StringBuffer::write(pSVar4,10,__buf_07,in_RCX);
        pvVar5 = extraout_RDX_03;
      }
      plVar6 = (long *)(lVar1 + 0x18);
    }
    lVar3 = *(long *)(lVar3 + 8);
  } while( true );
}

Assistant:

bool Writer::writeEM(Lattice *lattice, StringBuffer *os) const {
  static const float min_prob = 0.0001;
  for (const Node *node = lattice->bos_node(); node; node = node->next) {
    if (node->prob >= min_prob) {
      *os << "U\t";
      if (node->stat == MECAB_BOS_NODE) {
        *os << "BOS";
      } else if (node->stat == MECAB_EOS_NODE) {
        *os << "EOS";
      }  else {
        os->write(node->surface, node->length);
      }
      *os << '\t' << node->feature << '\t' << node->prob << '\n';
    }
    for (const Path *path = node->lpath; path; path = path->lnext) {
      if (path->prob >= min_prob) {
        *os << "B\t" << path->lnode->feature << '\t'
            << node->feature << '\t' << path->prob << '\n';
      }
    }
  }
  *os << "EOS\n";
  return true;
}